

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__list
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  URI *this_00;
  xmlChar **ppxVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  uint *puVar5;
  StringHash SVar6;
  void *pvVar7;
  undefined8 *puVar8;
  xmlChar *text;
  bool failed;
  ParserChar *attributeValue;
  bool local_141;
  ParserChar *local_140;
  StackMemoryManager *local_138;
  undefined8 *local_130;
  XSList<GeneratedSaxParser::ParserString> *local_128;
  uint *local_120;
  URI local_118;
  
  local_138 = &(this->
               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
               ).super_ParserTemplateBase.mStackMemoryManager;
  puVar5 = (uint *)GeneratedSaxParser::StackMemoryManager::newObject(local_138,0x128);
  uVar3 = list__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)puVar5 = list__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(puVar5 + 2) = uVar3;
  uVar3 = list__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(puVar5 + 4) = list__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(puVar5 + 6) = uVar3;
  uVar3 = list__AttributeData::DEFAULT._40_8_;
  *(undefined8 *)(puVar5 + 8) = list__AttributeData::DEFAULT._32_8_;
  *(undefined8 *)(puVar5 + 10) = uVar3;
  this_00 = (URI *)(puVar5 + 0xc);
  COLLADABU::URI::URI(this_00,(URI *)(list__AttributeData::DEFAULT + 0x30),false);
  uVar3 = list__AttributeData::DEFAULT._288_8_;
  *(undefined8 *)(puVar5 + 0x46) = list__AttributeData::DEFAULT._280_8_;
  *(undefined8 *)(puVar5 + 0x48) = uVar3;
  *attributeDataPtr = puVar5;
  ppxVar1 = attributes->attributes;
  if ((ppxVar1 != (xmlChar **)0x0) && (text = *ppxVar1, text != (xmlChar *)0x0)) {
    local_120 = puVar5 + 0x46;
    local_128 = (XSList<GeneratedSaxParser::ParserString> *)(puVar5 + 2);
    local_130 = &DAT_008374a0;
    do {
      SVar6 = GeneratedSaxParser::Utils::calculateStringHash(text);
      local_140 = ppxVar1[1];
      if ((long)SVar6 < 0x6a28a3) {
        if (SVar6 == 0x6f4) {
          *(ParserChar **)(puVar5 + 10) = local_140;
        }
        else if (SVar6 == 0x6f8b6) {
          GeneratedSaxParser::Utils::toURI(&local_118,&local_140,&local_141);
          COLLADABU::URI::operator=(this_00,&local_118);
          COLLADABU::URI::~URI(&local_118);
          if ((local_141 == true) &&
             (bVar4 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0x730a4,0x6f8b6,local_140), bVar4))
          {
            return false;
          }
          if ((local_141 & 1U) == 0) {
            *(byte *)puVar5 = (byte)*puVar5 | 2;
          }
        }
        else if (SVar6 == 0x7f8b6) {
          *(ParserChar **)(puVar5 + 8) = local_140;
        }
        else {
LAB_0073c3fb:
          if (*(long *)local_120 == 0) {
            pvVar7 = GeneratedSaxParser::StackMemoryManager::newObject(local_138,0x10);
          }
          else {
            pvVar7 = GeneratedSaxParser::StackMemoryManager::growObject(local_138,0x10);
          }
          *(void **)(puVar5 + 0x46) = pvVar7;
          lVar2 = *(long *)(puVar5 + 0x48);
          *(xmlChar **)((long)pvVar7 + lVar2 * 8) = text;
          *(ParserChar **)(*(long *)(puVar5 + 0x46) + 8 + lVar2 * 8) = local_140;
          *(long *)(puVar5 + 0x48) = lVar2 + 2;
        }
      }
      else if (SVar6 == 0x6a28a3) {
        bVar4 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ::
                characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                          (&this->
                            super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                           ,local_140,local_128);
        if (bVar4) {
          *(byte *)puVar5 = (byte)*puVar5 | 1;
        }
        else {
          SVar6 = 0x6a28a3;
LAB_0073c4fe:
          bVar4 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x730a4,SVar6,local_140);
          if (bVar4) {
            return false;
          }
        }
      }
      else if (SVar6 == 0x7ac025) {
        *(ParserChar **)(puVar5 + 6) = local_140;
      }
      else {
        if (SVar6 != 0x768ac2) goto LAB_0073c3fb;
        SVar6 = GeneratedSaxParser::Utils::calculateStringHash(local_140,(bool *)&local_118);
        puVar8 = &ENUM__mathml__list__orderMap;
        if ((SVar6 != 0xc4694d3) && (puVar8 = local_130, SVar6 != 0x5c3c883)) {
          local_118.mUriString._M_dataplus._M_p._0_1_ = 1;
          puVar5[1] = 2;
          SVar6 = 0x768ac2;
          goto LAB_0073c4fe;
        }
        puVar5[1] = *(uint *)(puVar8 + 1);
      }
      text = ppxVar1[2];
      ppxVar1 = ppxVar1 + 2;
    } while (text != (xmlChar *)0x0);
  }
  if ((*puVar5 & 1) == 0) {
    puVar5[2] = 0;
    puVar5[3] = 0;
    puVar5[4] = 0;
    puVar5[5] = 0;
  }
  if ((*puVar5 & 2) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(this_00,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__list( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__list( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

list__AttributeData* attributeData = newData<list__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ORDER:
    {
bool failed;
attributeData->order = Utils::toEnum<ENUM__mathml__list__order, StringHash, ENUM__mathml__list__order__COUNT>(attributeValue, failed, ENUM__mathml__list__orderMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIST,
        HASH_ATTRIBUTE_ORDER,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_LIST, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIST,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LIST,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= list__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIST,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= list__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & list__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & list__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}